

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O1

type __thiscall
nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
          (optional<tinyusdz::Relationship> *this,optional<tinyusdz::Relationship> *other)

{
  if (this->has_value_ == true) {
    if (other->has_value_ == false) {
      reset(this);
      return this;
    }
  }
  else {
    if (other->has_value_ == true) {
      initialize<tinyusdz::Relationship>(this,(Relationship *)&other->contained);
      return this;
    }
    if (this->has_value_ == false) {
      return this;
    }
  }
  if (other->has_value_ == true) {
    *(undefined4 *)&this->contained = *(undefined4 *)&other->contained;
    tinyusdz::Path::operator=
              ((Path *)((long)&this->contained + 8),(Path *)((long)&other->contained + 8));
    tinyusdz::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::_M_move_assign
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
               ((long)&this->contained + 0xd8),(undefined1 *)((long)&other->contained + 0xd8));
    *(undefined4 *)((long)&this->contained + 0xf0) = *(undefined4 *)((long)&other->contained + 0xf0)
    ;
    tinyusdz::AttrMetas::operator=
              ((AttrMetas *)((long)&this->contained + 0xf8),
               (AttrMetas *)((long)&other->contained + 0xf8));
    *(undefined1 *)((long)&this->contained + 0x300) =
         *(undefined1 *)((long)&other->contained + 0x300);
  }
  return this;
}

Assistant:

operator=( optional && other ) noexcept
    {
        if      ( (has_value() == true ) && (other.has_value() == false) ) { reset(); }
        else if ( (has_value() == false) && (other.has_value() == true ) ) { initialize( std::move( *other ) ); }
        else if ( (has_value() == true ) && (other.has_value() == true ) ) { contained.value() = std::move( *other ); }
        return *this;
    }